

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O0

void rec_mm_equal(jit_State *J,RecordIndex *ix,int op)

{
  undefined4 uVar1;
  anon_struct_8_2_f9ee98fb_for_u32 J_00;
  int iVar2;
  TRef TVar3;
  TRef in_EDX;
  cTValue *in_RSI;
  long in_RDI;
  TRef mt2_1;
  TRef mt2;
  TValue mo1v;
  TRef mo1;
  cTValue *bv;
  uint32_t uVar4;
  uint32_t op_00;
  undefined4 in_stack_ffffffffffffff50;
  uint32_t uVar5;
  cTValue *av;
  TRef in_stack_ffffffffffffff60;
  undefined8 in_stack_ffffffffffffffe8;
  MMS mm;
  undefined2 in_stack_fffffffffffffff0;
  undefined2 in_stack_fffffffffffffff2;
  undefined2 in_stack_fffffffffffffff4;
  undefined2 in_stack_fffffffffffffff6;
  jit_State *in_stack_fffffffffffffff8;
  
  mm = (MMS)((ulong)in_stack_ffffffffffffffe8 >> 0x20);
  in_RSI[6].field_2.field_0 = in_RSI[7].field_2.field_0;
  *in_RSI = in_RSI[2];
  iVar2 = lj_record_mm_lookup(in_stack_fffffffffffffff8,
                              (RecordIndex *)
                              CONCAT26(in_stack_fffffffffffffff6,
                                       CONCAT24(in_stack_fffffffffffffff4,
                                                CONCAT22(in_stack_fffffffffffffff2,
                                                         in_stack_fffffffffffffff0))),mm);
  if (iVar2 != 0) {
    uVar5 = in_RSI[8].u32.lo;
    J_00 = in_RSI[3].u32;
    op_00 = J_00.hi;
    uVar4 = J_00.lo;
    av = in_RSI + 1;
    if ((*(int *)((long)in_RSI + 0xc) == -0xc) &&
       ((ulong)*(uint *)((ulong)(av->u32).lo + 0x10) == in_RSI[4].u64)) {
      uVar1 = *(undefined4 *)((long)in_RSI + 0x34);
      *(undefined2 *)(in_RDI + 0x9c) = 0x430b;
      *(short *)(in_RDI + 0x98) = (short)uVar1;
      *(undefined2 *)(in_RDI + 0x9a) = 3;
      TVar3 = lj_opt_fold((jit_State *)J_00);
      uVar1 = *(undefined4 *)((long)in_RSI + 0x3c);
      *(undefined2 *)(in_RDI + 0x9c) = 0x88b;
      *(short *)(in_RDI + 0x98) = (short)TVar3;
      *(short *)(in_RDI + 0x9a) = (short)uVar1;
      lj_opt_fold((jit_State *)CONCAT44(op_00,uVar4));
    }
    else if ((*(int *)((long)in_RSI + 0xc) == -0xd) &&
            ((ulong)*(uint *)((ulong)(av->u32).lo + 0x10) == in_RSI[4].u64)) {
      uVar1 = *(undefined4 *)((long)in_RSI + 0x34);
      *(undefined2 *)(in_RDI + 0x9c) = 0x430b;
      *(short *)(in_RDI + 0x98) = (short)uVar1;
      *(undefined2 *)(in_RDI + 0x9a) = 9;
      TVar3 = lj_opt_fold((jit_State *)J_00);
      uVar1 = *(undefined4 *)((long)in_RSI + 0x3c);
      *(undefined2 *)(in_RDI + 0x9c) = 0x88b;
      *(short *)(in_RDI + 0x98) = (short)TVar3;
      *(short *)(in_RDI + 0x9a) = (short)uVar1;
      lj_opt_fold((jit_State *)CONCAT44(op_00,uVar4));
    }
    else {
      in_RSI[6].field_2.field_0 =
           *(anon_union_4_2_de2f9c34_for_anon_struct_8_2_fd66bcdd_for_TValue_2_0 *)
            ((long)in_RSI + 0x34);
      in_RSI->u32 = *(anon_struct_8_2_f9ee98fb_for_u32 *)av;
      iVar2 = lj_record_mm_lookup(in_stack_fffffffffffffff8,
                                  (RecordIndex *)
                                  CONCAT26(in_stack_fffffffffffffff6,
                                           CONCAT24(in_stack_fffffffffffffff4,
                                                    CONCAT22(in_stack_fffffffffffffff2,
                                                             in_stack_fffffffffffffff0))),mm);
      if (iVar2 == 0) {
        return;
      }
      iVar2 = lj_record_objcmp((jit_State *)&in_RSI->field_2,in_EDX,in_stack_ffffffffffffff60,av,
                               (cTValue *)CONCAT44(uVar5,in_stack_ffffffffffffff50));
      if (iVar2 != 0) {
        return;
      }
    }
    rec_mm_callcomp((jit_State *)&av->field_2,
                    (RecordIndex *)CONCAT44(uVar5,in_stack_ffffffffffffff50),op_00);
  }
  return;
}

Assistant:

static void rec_mm_equal(jit_State *J, RecordIndex *ix, int op)
{
  ix->tab = ix->val;
  copyTV(J->L, &ix->tabv, &ix->valv);
  if (lj_record_mm_lookup(J, ix, MM_eq)) {  /* Lookup mm on 1st operand. */
    cTValue *bv;
    TRef mo1 = ix->mobj;
    TValue mo1v;
    copyTV(J->L, &mo1v, &ix->mobjv);
    /* Avoid the 2nd lookup and the objcmp if the metatables are equal. */
    bv = &ix->keyv;
    if (tvistab(bv) && tabref(tabV(bv)->metatable) == ix->mtv) {
      TRef mt2 = emitir(IRT(IR_FLOAD, IRT_TAB), ix->key, IRFL_TAB_META);
      emitir(IRTG(IR_EQ, IRT_TAB), mt2, ix->mt);
    } else if (tvisudata(bv) && tabref(udataV(bv)->metatable) == ix->mtv) {
      TRef mt2 = emitir(IRT(IR_FLOAD, IRT_TAB), ix->key, IRFL_UDATA_META);
      emitir(IRTG(IR_EQ, IRT_TAB), mt2, ix->mt);
    } else {  /* Lookup metamethod on 2nd operand and compare both. */
      ix->tab = ix->key;
      copyTV(J->L, &ix->tabv, bv);
      if (!lj_record_mm_lookup(J, ix, MM_eq) ||
	  lj_record_objcmp(J, mo1, ix->mobj, &mo1v, &ix->mobjv))
	return;
    }
    rec_mm_callcomp(J, ix, op);
  }
}